

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-fs-event.c
# Opt level: O3

int run_test_fs_event_close_in_callback(void)

{
  char *__s;
  size_t sVar1;
  int iVar2;
  int extraout_EAX;
  undefined8 uVar3;
  undefined8 uVar4;
  uv_fs_event_t *puVar5;
  uv_fs_event_t *puVar6;
  size_t sVar7;
  int in_ECX;
  int extraout_EDX;
  long lVar8;
  code *__s1;
  undefined8 in_R8;
  undefined8 in_R9;
  size_t sStack_580;
  char acStack_578 [1032];
  uv_fs_event_t *puStack_170;
  uv_fs_event_t uStack_130;
  uv_fs_event_t uStack_a8;
  undefined8 uStack_20;
  
  uVar3 = uv_default_loop();
  fs_event_unlink_files((uv_timer_t *)0x0);
  create_dir("watch_dir");
  iVar2 = uv_fs_event_init(uVar3,&fs_event);
  if (iVar2 == 0) {
    in_ECX = 0;
    iVar2 = uv_fs_event_start(&fs_event,fs_event_cb_close,"watch_dir");
    if (iVar2 != 0) goto LAB_0015173c;
    iVar2 = uv_timer_init(uVar3,&timer);
    if (iVar2 != 0) goto LAB_00151741;
    in_ECX = 0;
    iVar2 = uv_timer_start(&timer,fs_event_create_files,100);
    if (iVar2 != 0) goto LAB_00151746;
    uv_run(uVar3,0);
    uv_close(&timer,close_cb);
    uv_run(uVar3,1);
    if (close_cb_called != 2) goto LAB_0015174b;
    if (fs_event_cb_called != 3) goto LAB_00151750;
    fs_event_unlink_files((uv_timer_t *)0x0);
    remove("watch_dir/");
    uVar3 = uv_default_loop();
    uv_walk(uVar3,close_walk_cb,0);
    uv_run(uVar3,0);
    uVar4 = uv_default_loop();
    iVar2 = uv_loop_close(uVar4);
    if (iVar2 == 0) {
      return 0;
    }
  }
  else {
    run_test_fs_event_close_in_callback_cold_1();
LAB_0015173c:
    run_test_fs_event_close_in_callback_cold_2();
LAB_00151741:
    run_test_fs_event_close_in_callback_cold_3();
LAB_00151746:
    run_test_fs_event_close_in_callback_cold_4();
LAB_0015174b:
    run_test_fs_event_close_in_callback_cold_5();
LAB_00151750:
    run_test_fs_event_close_in_callback_cold_6();
  }
  run_test_fs_event_close_in_callback_cold_7();
  if (in_ECX == 0) {
    if (fs_event_cb_called < 3) {
      fs_event_cb_called = fs_event_cb_called + 1;
      if (fs_event_cb_called == 3) {
        iVar2 = uv_close();
        return iVar2;
      }
      return extraout_EAX;
    }
  }
  else {
    fs_event_cb_close_cold_1();
  }
  fs_event_cb_close_cold_2();
  uStack_20 = uVar3;
  puVar5 = (uv_fs_event_t *)uv_default_loop();
  create_dir("watch_dir");
  __s1 = (code *)&uStack_a8;
  puVar6 = puVar5;
  iVar2 = uv_fs_event_init();
  if (iVar2 == 0) {
    __s1 = fs_event_cb_dir;
    puVar6 = &uStack_a8;
    in_ECX = 0;
    iVar2 = uv_fs_event_start(puVar6,fs_event_cb_dir,"watch_dir");
    if (iVar2 != 0) goto LAB_001518ab;
    __s1 = (code *)&uStack_130;
    puVar6 = puVar5;
    iVar2 = uv_fs_event_init();
    if (iVar2 != 0) goto LAB_001518b0;
    __s1 = fs_event_cb_dir;
    puVar6 = &uStack_130;
    in_ECX = 0;
    iVar2 = uv_fs_event_start(puVar6,fs_event_cb_dir,"watch_dir");
    if (iVar2 != 0) goto LAB_001518b5;
    uv_close(&uStack_130,close_cb);
    uv_close(&uStack_a8);
    __s1 = (code *)0x0;
    puVar6 = puVar5;
    uv_run();
    if (close_cb_called != 2) goto LAB_001518ba;
    remove("watch_dir/");
    puVar5 = (uv_fs_event_t *)uv_default_loop();
    uv_walk(puVar5,close_walk_cb,0);
    __s1 = (code *)0x0;
    uv_run(puVar5);
    puVar6 = (uv_fs_event_t *)uv_default_loop();
    iVar2 = uv_loop_close();
    if (iVar2 == 0) {
      return 0;
    }
  }
  else {
    run_test_fs_event_start_and_close_cold_1();
LAB_001518ab:
    run_test_fs_event_start_and_close_cold_2();
LAB_001518b0:
    run_test_fs_event_start_and_close_cold_3();
LAB_001518b5:
    run_test_fs_event_start_and_close_cold_4();
LAB_001518ba:
    run_test_fs_event_start_and_close_cold_5();
  }
  run_test_fs_event_start_and_close_cold_6();
  fs_event_cb_called = fs_event_cb_called + 1;
  if (puVar6 == &fs_event) {
    if (in_ECX != 0) goto LAB_0015191f;
    if (extraout_EDX != 2) goto LAB_00151924;
    iVar2 = strcmp((char *)__s1,"file1");
    if (iVar2 != 0) goto LAB_00151929;
    iVar2 = uv_fs_event_stop(&fs_event);
    if (iVar2 == 0) {
      iVar2 = uv_close(&fs_event,close_cb);
      return iVar2;
    }
  }
  else {
    fs_event_cb_dir_cold_1();
LAB_0015191f:
    fs_event_cb_dir_cold_2();
LAB_00151924:
    fs_event_cb_dir_cold_3();
LAB_00151929:
    fs_event_cb_dir_cold_4();
  }
  fs_event_cb_dir_cold_5();
  puStack_170 = puVar5;
  uVar3 = uv_default_loop();
  create_dir("watch_dir");
  create_dir("watch_dir/subfolder");
  lVar8 = 0;
  do {
    iVar2 = uv_fs_event_init(uVar3,&fs_event);
    if (iVar2 != 0) {
LAB_00151b28:
      run_test_fs_event_getpath_cold_1();
      goto LAB_00151b2d;
    }
    sStack_580 = 0x400;
    iVar2 = uv_fs_event_getpath(&fs_event,acStack_578,&sStack_580);
    if (iVar2 != -0x16) {
LAB_00151b23:
      run_test_fs_event_getpath_cold_2();
      goto LAB_00151b28;
    }
    __s = *(char **)((long)&DAT_001c8ca0 + lVar8);
    iVar2 = uv_fs_event_start(&fs_event,fail_cb,__s,0);
    if (iVar2 != 0) {
LAB_00151b1e:
      run_test_fs_event_getpath_cold_3();
      goto LAB_00151b23;
    }
    sStack_580 = 0;
    iVar2 = uv_fs_event_getpath(&fs_event,acStack_578,&sStack_580);
    sVar1 = sStack_580;
    if (iVar2 != -0x69) {
LAB_00151b19:
      run_test_fs_event_getpath_cold_4();
      goto LAB_00151b1e;
    }
    if (0x3ff < sStack_580) {
LAB_00151b14:
      run_test_fs_event_getpath_cold_5();
      goto LAB_00151b19;
    }
    sVar7 = strlen(__s);
    if (sVar1 != sVar7 + 1) {
LAB_00151b0f:
      run_test_fs_event_getpath_cold_6();
      goto LAB_00151b14;
    }
    iVar2 = uv_fs_event_getpath(&fs_event,acStack_578,&sStack_580);
    sVar1 = sStack_580;
    if (iVar2 != 0) {
LAB_00151b0a:
      run_test_fs_event_getpath_cold_7();
      goto LAB_00151b0f;
    }
    sVar7 = strlen(__s);
    if (sVar1 != sVar7) {
LAB_00151b05:
      run_test_fs_event_getpath_cold_8();
      goto LAB_00151b0a;
    }
    iVar2 = strcmp(acStack_578,__s);
    if (iVar2 != 0) {
LAB_00151b00:
      run_test_fs_event_getpath_cold_9();
      goto LAB_00151b05;
    }
    iVar2 = uv_fs_event_stop(&fs_event);
    if (iVar2 != 0) {
LAB_00151afb:
      run_test_fs_event_getpath_cold_10();
      goto LAB_00151b00;
    }
    uv_close(&fs_event,close_cb);
    uv_run(uVar3,0);
    if (close_cb_called != 1) {
      run_test_fs_event_getpath_cold_11();
      goto LAB_00151afb;
    }
    close_cb_called = 0;
    lVar8 = lVar8 + 8;
  } while (lVar8 != 0x28);
  remove("watch_dir/");
  uVar3 = uv_default_loop();
  uv_walk(uVar3,close_walk_cb,0);
  uv_run(uVar3,0);
  uVar3 = uv_default_loop();
  iVar2 = uv_loop_close(uVar3);
  if (iVar2 == 0) {
    return 0;
  }
LAB_00151b2d:
  run_test_fs_event_getpath_cold_12();
  uVar3 = uv_default_loop();
  uv_walk(uVar3,close_walk_cb,0);
  uv_run(uVar3,0);
  uVar4 = uv_default_loop();
  iVar2 = uv_loop_close(uVar4);
  if (iVar2 == 0) {
    return 0;
  }
  run_test_fs_event_error_reporting_cold_1();
  puVar6 = (uv_fs_event_t *)uv_default_loop();
  iVar2 = uv_fs_event_init(puVar6,&fs_event);
  if (iVar2 == 0) {
    puVar6 = &fs_event;
    iVar2 = uv_fs_event_start(&fs_event,fs_event_cb_file,"<:;",0,in_R8,in_R9,uVar3);
    if (iVar2 == 0) goto LAB_00151c2a;
    puVar6 = &fs_event;
    iVar2 = uv_is_active(&fs_event);
    if (iVar2 != 0) goto LAB_00151c2f;
    puVar6 = &fs_event;
    iVar2 = uv_fs_event_start(&fs_event,fs_event_cb_file,"",0,in_R8,in_R9,uVar3);
    if (iVar2 == 0) goto LAB_00151c34;
    puVar6 = &fs_event;
    iVar2 = uv_is_active(&fs_event);
    if (iVar2 == 0) {
      uVar3 = uv_default_loop();
      uv_walk(uVar3,close_walk_cb,0);
      uv_run(uVar3,0);
      puVar6 = (uv_fs_event_t *)uv_default_loop();
      iVar2 = uv_loop_close(puVar6);
      if (iVar2 == 0) {
        return 0;
      }
      goto LAB_00151c3e;
    }
  }
  else {
    run_test_fs_event_watch_invalid_path_cold_1();
LAB_00151c2a:
    run_test_fs_event_watch_invalid_path_cold_6();
LAB_00151c2f:
    run_test_fs_event_watch_invalid_path_cold_2();
LAB_00151c34:
    run_test_fs_event_watch_invalid_path_cold_5();
  }
  run_test_fs_event_watch_invalid_path_cold_3();
LAB_00151c3e:
  run_test_fs_event_watch_invalid_path_cold_4();
  iVar2 = uv_is_closing();
  if (iVar2 != 0) {
    return iVar2;
  }
  iVar2 = uv_close(puVar6,0);
  return iVar2;
}

Assistant:

TEST_IMPL(fs_event_close_in_callback) {
#if defined(NO_FS_EVENTS)
  RETURN_SKIP(NO_FS_EVENTS);
#elif defined(__MVS__)
  RETURN_SKIP("Directory watching not supported on this platform.");
#endif
  uv_loop_t* loop;
  int r;

  loop = uv_default_loop();

  fs_event_unlink_files(NULL);
  create_dir("watch_dir");

  r = uv_fs_event_init(loop, &fs_event);
  ASSERT(r == 0);
  r = uv_fs_event_start(&fs_event, fs_event_cb_close, "watch_dir", 0);
  ASSERT(r == 0);

  r = uv_timer_init(loop, &timer);
  ASSERT(r == 0);
  r = uv_timer_start(&timer, fs_event_create_files, 100, 0);
  ASSERT(r == 0);

  uv_run(loop, UV_RUN_DEFAULT);

  uv_close((uv_handle_t*)&timer, close_cb);

  uv_run(loop, UV_RUN_ONCE);

  ASSERT(close_cb_called == 2);
  ASSERT(fs_event_cb_called == 3);

  /* Clean up */
  fs_event_unlink_files(NULL);
  remove("watch_dir/");

  MAKE_VALGRIND_HAPPY();
  return 0;
}